

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int userauth_hostbased_fromfile
              (LIBSSH2_SESSION *session,char *username,size_t username_len,char *publickey,
              char *privatekey,char *passphrase,char *hostname,size_t hostname_len,char *param_9,
              size_t param_10)

{
  undefined1 *puVar1;
  int iVar2;
  undefined8 uVar3;
  size_t local_e0;
  size_t local_d8;
  size_t data_len;
  uchar *newpacket;
  iovec datavec [4];
  uchar local_7d [5];
  uchar buf [5];
  void *abstract;
  size_t sig_len;
  size_t pubkeydata_len;
  uchar *sig;
  uchar *pubkeydata;
  LIBSSH2_HOSTKEY_METHOD *privkeyobj;
  char *pcStack_40;
  int rc;
  char *passphrase_local;
  char *privatekey_local;
  char *publickey_local;
  size_t username_len_local;
  char *username_local;
  LIBSSH2_SESSION *session_local;
  
  pcStack_40 = passphrase;
  passphrase_local = privatekey;
  privatekey_local = publickey;
  publickey_local = (char *)username_len;
  username_len_local = (size_t)username;
  username_local = (char *)session;
  if (session->userauth_host_state == libssh2_NB_state_idle) {
    sig = (uchar *)0x0;
    pubkeydata_len = 0;
    sig_len = 0;
    abstract = (void *)0x0;
    memset(&session->userauth_host_packet_requirev_state,0,8);
    if (privatekey_local == (char *)0x0) {
      iVar2 = _libssh2_pub_priv_keyfile
                        ((LIBSSH2_SESSION *)username_local,(uchar **)(username_local + 0xd110),
                         (size_t *)(username_local + 0xd118),&sig,&sig_len,passphrase_local,
                         pcStack_40);
    }
    else {
      iVar2 = file_read_publickey((LIBSSH2_SESSION *)username_local,
                                  (uchar **)(username_local + 0xd110),
                                  (size_t *)(username_local + 0xd118),&sig,&sig_len,privatekey_local
                                 );
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    privkeyobj._4_4_ = 0;
    *(char **)(username_local + 0xd108) =
         publickey_local +
         sig_len + param_10 + hostname_len + *(long *)(username_local + 0xd118) + 0x34;
    uVar3 = (**(code **)(username_local + 8))
                      (*(long *)(username_local + 0xd108) + *(long *)(username_local + 0xd118) +
                       sig_len + 0xc,username_local);
    *(undefined8 *)(username_local + 0xd100) = uVar3;
    *(undefined8 *)(username_local + 0xd120) = uVar3;
    if (*(long *)(username_local + 0xd100) == 0) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd110),username_local);
      username_local[0xd110] = '\0';
      username_local[0xd111] = '\0';
      username_local[0xd112] = '\0';
      username_local[0xd113] = '\0';
      username_local[0xd114] = '\0';
      username_local[0xd115] = '\0';
      username_local[0xd116] = '\0';
      username_local[0xd117] = '\0';
      (**(code **)(username_local + 0x18))(sig,username_local);
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)username_local,-6,"Out of memory");
      return iVar2;
    }
    puVar1 = *(undefined1 **)(username_local + 0xd120);
    *(undefined1 **)(username_local + 0xd120) = puVar1 + 1;
    *puVar1 = 0x32;
    _libssh2_store_str((uchar **)(username_local + 0xd120),(char *)username_len_local,
                       (size_t)publickey_local);
    _libssh2_store_str((uchar **)(username_local + 0xd120),"ssh-connection",0xe);
    _libssh2_store_str((uchar **)(username_local + 0xd120),"hostbased",9);
    _libssh2_store_str((uchar **)(username_local + 0xd120),*(char **)(username_local + 0xd110),
                       *(size_t *)(username_local + 0xd118));
    _libssh2_store_str((uchar **)(username_local + 0xd120),(char *)sig,sig_len);
    (**(code **)(username_local + 0x18))(sig,username_local);
    _libssh2_store_str((uchar **)(username_local + 0xd120),hostname,hostname_len);
    _libssh2_store_str((uchar **)(username_local + 0xd120),param_9,param_10);
    privkeyobj._4_4_ =
         file_read_privatekey
                   ((LIBSSH2_SESSION *)username_local,(LIBSSH2_HOSTKEY_METHOD **)&pubkeydata,
                    (void **)&stack0xffffffffffffff88,*(uchar **)(username_local + 0xd110),
                    (int)*(undefined8 *)(username_local + 0xd118),passphrase_local,pcStack_40);
    if (privkeyobj._4_4_ != 0) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd110),username_local);
      username_local[0xd110] = '\0';
      username_local[0xd111] = '\0';
      username_local[0xd112] = '\0';
      username_local[0xd113] = '\0';
      username_local[0xd114] = '\0';
      username_local[0xd115] = '\0';
      username_local[0xd116] = '\0';
      username_local[0xd117] = '\0';
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd100),username_local);
      username_local[0xd100] = '\0';
      username_local[0xd101] = '\0';
      username_local[0xd102] = '\0';
      username_local[0xd103] = '\0';
      username_local[0xd104] = '\0';
      username_local[0xd105] = '\0';
      username_local[0xd106] = '\0';
      username_local[0xd107] = '\0';
      return privkeyobj._4_4_;
    }
    _libssh2_htonu32(local_7d,*(uint32_t *)(username_local + 0x90));
    newpacket = local_7d;
    datavec[0].iov_base = (void *)0x4;
    datavec[0].iov_len = *(size_t *)(username_local + 0x88);
    datavec[1].iov_base = (void *)(ulong)*(uint *)(username_local + 0x90);
    datavec[1].iov_len = *(size_t *)(username_local + 0xd100);
    datavec[2].iov_base = *(void **)(username_local + 0xd108);
    if (((pubkeydata != (uchar *)0x0) && (*(long *)(pubkeydata + 0x30) != 0)) &&
       (iVar2 = (**(code **)(pubkeydata + 0x30))(username_local,&pubkeydata_len,&abstract,3),
       iVar2 != 0)) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd110),username_local);
      username_local[0xd110] = '\0';
      username_local[0xd111] = '\0';
      username_local[0xd112] = '\0';
      username_local[0xd113] = '\0';
      username_local[0xd114] = '\0';
      username_local[0xd115] = '\0';
      username_local[0xd116] = '\0';
      username_local[0xd117] = '\0';
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd100),username_local);
      username_local[0xd100] = '\0';
      username_local[0xd101] = '\0';
      username_local[0xd102] = '\0';
      username_local[0xd103] = '\0';
      username_local[0xd104] = '\0';
      username_local[0xd105] = '\0';
      username_local[0xd106] = '\0';
      username_local[0xd107] = '\0';
      if (*(long *)(pubkeydata + 0x40) != 0) {
        (**(code **)(pubkeydata + 0x40))(username_local,&stack0xffffffffffffff88);
      }
      return -1;
    }
    if ((pubkeydata != (uchar *)0x0) && (*(long *)(pubkeydata + 0x40) != 0)) {
      (**(code **)(pubkeydata + 0x40))(username_local,&stack0xffffffffffffff88);
    }
    if (sig_len < abstract) {
      if (*(long *)(username_local + 0xd100) == 0) {
        local_e0 = (**(code **)(username_local + 8))
                             ((long)abstract +
                              *(long *)(username_local + 0xd108) +
                              *(long *)(username_local + 0xd118) + 0xc,username_local);
      }
      else {
        local_e0 = (**(code **)(username_local + 0x10))
                             (*(undefined8 *)(username_local + 0xd100),
                              (long)abstract +
                              *(long *)(username_local + 0xd108) +
                              *(long *)(username_local + 0xd118) + 0xc,username_local);
      }
      data_len = local_e0;
      if (local_e0 == 0) {
        (**(code **)(username_local + 0x18))(pubkeydata_len,username_local);
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(username_local + 0xd100),username_local);
        username_local[0xd100] = '\0';
        username_local[0xd101] = '\0';
        username_local[0xd102] = '\0';
        username_local[0xd103] = '\0';
        username_local[0xd104] = '\0';
        username_local[0xd105] = '\0';
        username_local[0xd106] = '\0';
        username_local[0xd107] = '\0';
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(username_local + 0xd110),username_local);
        username_local[0xd110] = '\0';
        username_local[0xd111] = '\0';
        username_local[0xd112] = '\0';
        username_local[0xd113] = '\0';
        username_local[0xd114] = '\0';
        username_local[0xd115] = '\0';
        username_local[0xd116] = '\0';
        username_local[0xd117] = '\0';
        iVar2 = _libssh2_error((LIBSSH2_SESSION *)username_local,-6,
                               "Failed allocating additional space for userauth-hostbased packet");
        return iVar2;
      }
      *(size_t *)(username_local + 0xd100) = local_e0;
    }
    *(long *)(username_local + 0xd120) =
         *(long *)(username_local + 0xd100) + *(long *)(username_local + 0xd108);
    _libssh2_store_u32((uchar **)(username_local + 0xd120),
                       (int)*(undefined8 *)(username_local + 0xd118) + 8 + (int)abstract);
    _libssh2_store_str((uchar **)(username_local + 0xd120),*(char **)(username_local + 0xd110),
                       *(size_t *)(username_local + 0xd118));
    (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd110),username_local);
    username_local[0xd110] = '\0';
    username_local[0xd111] = '\0';
    username_local[0xd112] = '\0';
    username_local[0xd113] = '\0';
    username_local[0xd114] = '\0';
    username_local[0xd115] = '\0';
    username_local[0xd116] = '\0';
    username_local[0xd117] = '\0';
    _libssh2_store_str((uchar **)(username_local + 0xd120),(char *)pubkeydata_len,(size_t)abstract);
    (**(code **)(username_local + 0x18))(pubkeydata_len,username_local);
    username_local[0xd0e8] = '\x02';
    username_local[0xd0e9] = '\0';
    username_local[0xd0ea] = '\0';
    username_local[0xd0eb] = '\0';
  }
  if (*(int *)(username_local + 0xd0e8) == 2) {
    privkeyobj._4_4_ =
         _libssh2_transport_send
                   ((LIBSSH2_SESSION *)username_local,*(uchar **)(username_local + 0xd100),
                    *(long *)(username_local + 0xd120) - *(long *)(username_local + 0xd100),
                    (uchar *)0x0,0);
    if (privkeyobj._4_4_ == -0x25) {
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x25,"Would block");
      return iVar2;
    }
    if (privkeyobj._4_4_ != 0) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd100),username_local);
      username_local[0xd100] = '\0';
      username_local[0xd101] = '\0';
      username_local[0xd102] = '\0';
      username_local[0xd103] = '\0';
      username_local[0xd104] = '\0';
      username_local[0xd105] = '\0';
      username_local[0xd106] = '\0';
      username_local[0xd107] = '\0';
      username_local[0xd0e8] = '\0';
      username_local[0xd0e9] = '\0';
      username_local[0xd0ea] = '\0';
      username_local[0xd0eb] = '\0';
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)username_local,-7,
                             "Unable to send userauth-hostbased request");
      return iVar2;
    }
    (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd100),username_local);
    username_local[0xd100] = '\0';
    username_local[0xd101] = '\0';
    username_local[0xd102] = '\0';
    username_local[0xd103] = '\0';
    username_local[0xd104] = '\0';
    username_local[0xd105] = '\0';
    username_local[0xd106] = '\0';
    username_local[0xd107] = '\0';
    username_local[0xd0e8] = '\x03';
    username_local[0xd0e9] = '\0';
    username_local[0xd0ea] = '\0';
    username_local[0xd0eb] = '\0';
  }
  if (*(int *)(username_local + 0xd0e8) == 3) {
    privkeyobj._4_4_ =
         _libssh2_packet_requirev
                   ((LIBSSH2_SESSION *)username_local,"43",(uchar **)(username_local + 0xd0f0),
                    &local_d8,0,(uchar *)0x0,0,(packet_requirev_state_t *)(username_local + 0xd128))
    ;
    if (privkeyobj._4_4_ == -0x25) {
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x25,"Would block");
      return iVar2;
    }
    username_local[0xd0e8] = '\0';
    username_local[0xd0e9] = '\0';
    username_local[0xd0ea] = '\0';
    username_local[0xd0eb] = '\0';
    if ((privkeyobj._4_4_ != 0) || (local_d8 == 0)) {
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x13,"Auth failed");
      return iVar2;
    }
    if (**(char **)(username_local + 0xd0f0) == '4') {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd0f0),username_local);
      username_local[0xd0f0] = '\0';
      username_local[0xd0f1] = '\0';
      username_local[0xd0f2] = '\0';
      username_local[0xd0f3] = '\0';
      username_local[0xd0f4] = '\0';
      username_local[0xd0f5] = '\0';
      username_local[0xd0f6] = '\0';
      username_local[0xd0f7] = '\0';
      *(uint *)(username_local + 0x68) = *(uint *)(username_local + 0x68) | 4;
      return 0;
    }
    privkeyobj._4_4_ = 0;
  }
  (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0xd0f0),username_local);
  username_local[0xd0f0] = '\0';
  username_local[0xd0f1] = '\0';
  username_local[0xd0f2] = '\0';
  username_local[0xd0f3] = '\0';
  username_local[0xd0f4] = '\0';
  username_local[0xd0f5] = '\0';
  username_local[0xd0f6] = '\0';
  username_local[0xd0f7] = '\0';
  iVar2 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x13,
                         "Invalid signature for supplied public key, or bad username/public key combination"
                        );
  return iVar2;
}

Assistant:

static int
userauth_hostbased_fromfile(LIBSSH2_SESSION *session,
                            const char *username, size_t username_len,
                            const char *publickey, const char *privatekey,
                            const char *passphrase, const char *hostname,
                            size_t hostname_len,
                            const char *local_username,
                            size_t local_username_len)
{
    int rc;

    if(session->userauth_host_state == libssh2_NB_state_idle) {
        const LIBSSH2_HOSTKEY_METHOD *privkeyobj;
        unsigned char *pubkeydata = NULL;
        unsigned char *sig = NULL;
        size_t pubkeydata_len = 0;
        size_t sig_len = 0;
        void *abstract;
        unsigned char buf[5];
        struct iovec datavec[4];

        /* Zero the whole thing out */
        memset(&session->userauth_host_packet_requirev_state, 0,
               sizeof(session->userauth_host_packet_requirev_state));

        if(publickey) {
            rc = file_read_publickey(session, &session->userauth_host_method,
                                     &session->userauth_host_method_len,
                                     &pubkeydata, &pubkeydata_len, publickey);
            if(rc)
                /* Note: file_read_publickey() calls _libssh2_error() */
                return rc;
        }
        else {
            /* Compute public key from private key. */
            rc = _libssh2_pub_priv_keyfile(session,
                                           &session->userauth_host_method,
                                           &session->userauth_host_method_len,
                                           &pubkeydata, &pubkeydata_len,
                                           privatekey, passphrase);
            if(rc)
                /* libssh2_pub_priv_keyfile calls _libssh2_error() */
                return rc;
        }

        /*
         * 52 = packet_type(1) + username_len(4) + servicename_len(4) +
         * service_name(14)"ssh-connection" + authmethod_len(4) +
         * authmethod(9)"hostbased" + method_len(4) + pubkeydata_len(4) +
         * hostname_len(4) + local_username_len(4)
         */
        session->userauth_host_packet_len =
            username_len + session->userauth_host_method_len + hostname_len +
            local_username_len + pubkeydata_len + 52;

        /*
         * Preallocate space for an overall length,  method name again,
         * and the signature, which won't be any larger than the size of
         * the publickeydata itself
         */
        session->userauth_host_s = session->userauth_host_packet =
            LIBSSH2_ALLOC(session,
                          session->userauth_host_packet_len + 4 +
                          (4 + session->userauth_host_method_len) +
                          (4 + pubkeydata_len));
        if(!session->userauth_host_packet) {
            LIBSSH2_FREE(session, session->userauth_host_method);
            session->userauth_host_method = NULL;
            LIBSSH2_FREE(session, pubkeydata);
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Out of memory");
        }

        *(session->userauth_host_s++) = SSH_MSG_USERAUTH_REQUEST;
        _libssh2_store_str(&session->userauth_host_s, username, username_len);
        _libssh2_store_str(&session->userauth_host_s, "ssh-connection", 14);
        _libssh2_store_str(&session->userauth_host_s, "hostbased", 9);
        _libssh2_store_str(&session->userauth_host_s,
                           (const char *)session->userauth_host_method,
                           session->userauth_host_method_len);
        _libssh2_store_str(&session->userauth_host_s, (const char *)pubkeydata,
                           pubkeydata_len);
        LIBSSH2_FREE(session, pubkeydata);
        _libssh2_store_str(&session->userauth_host_s, hostname, hostname_len);
        _libssh2_store_str(&session->userauth_host_s, local_username,
                           local_username_len);

        rc = file_read_privatekey(session, &privkeyobj, &abstract,
                                  session->userauth_host_method,
                                  session->userauth_host_method_len,
                                  privatekey, passphrase);
        if(rc) {
            /* Note: file_read_privatekey() calls _libssh2_error() */
            LIBSSH2_FREE(session, session->userauth_host_method);
            session->userauth_host_method = NULL;
            LIBSSH2_FREE(session, session->userauth_host_packet);
            session->userauth_host_packet = NULL;
            return rc;
        }

        _libssh2_htonu32(buf, session->session_id_len);
        libssh2_prepare_iovec(datavec, 4);
        datavec[0].iov_base = (void *)buf;
        datavec[0].iov_len = 4;
        datavec[1].iov_base = (void *)session->session_id;
        datavec[1].iov_len = session->session_id_len;
        datavec[2].iov_base = (void *)session->userauth_host_packet;
        datavec[2].iov_len = session->userauth_host_packet_len;

        if(privkeyobj && privkeyobj->signv &&
                          privkeyobj->signv(session, &sig, &sig_len, 3,
                                            datavec, &abstract)) {
            LIBSSH2_FREE(session, session->userauth_host_method);
            session->userauth_host_method = NULL;
            LIBSSH2_FREE(session, session->userauth_host_packet);
            session->userauth_host_packet = NULL;
            if(privkeyobj->dtor) {
                privkeyobj->dtor(session, &abstract);
            }
            return -1;
        }

        if(privkeyobj && privkeyobj->dtor) {
            privkeyobj->dtor(session, &abstract);
        }

        if(sig_len > pubkeydata_len) {
            unsigned char *newpacket;
            /* Should *NEVER* happen, but...well.. better safe than sorry */
            newpacket = LIBSSH2_REALLOC(session, session->userauth_host_packet,
                                        session->userauth_host_packet_len + 4 +
                                        (4 + session->userauth_host_method_len)
                                        + (4 + sig_len)); /* PK sigblob */
            if(!newpacket) {
                LIBSSH2_FREE(session, sig);
                LIBSSH2_FREE(session, session->userauth_host_packet);
                session->userauth_host_packet = NULL;
                LIBSSH2_FREE(session, session->userauth_host_method);
                session->userauth_host_method = NULL;
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "Failed allocating additional space for "
                                      "userauth-hostbased packet");
            }
            session->userauth_host_packet = newpacket;
        }

        session->userauth_host_s =
            session->userauth_host_packet + session->userauth_host_packet_len;

        _libssh2_store_u32(&session->userauth_host_s,
                           4 + session->userauth_host_method_len +
                           4 + sig_len);
        _libssh2_store_str(&session->userauth_host_s,
                           (const char *)session->userauth_host_method,
                           session->userauth_host_method_len);
        LIBSSH2_FREE(session, session->userauth_host_method);
        session->userauth_host_method = NULL;

        _libssh2_store_str(&session->userauth_host_s, (const char *)sig,
                           sig_len);
        LIBSSH2_FREE(session, sig);

        _libssh2_debug(session, LIBSSH2_TRACE_AUTH,
                       "Attempting hostbased authentication");

        session->userauth_host_state = libssh2_NB_state_created;
    }

    if(session->userauth_host_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, session->userauth_host_packet,
                                     session->userauth_host_s -
                                     session->userauth_host_packet,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                  "Would block");
        }
        else if(rc) {
            LIBSSH2_FREE(session, session->userauth_host_packet);
            session->userauth_host_packet = NULL;
            session->userauth_host_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send userauth-hostbased request");
        }
        LIBSSH2_FREE(session, session->userauth_host_packet);
        session->userauth_host_packet = NULL;

        session->userauth_host_state = libssh2_NB_state_sent;
    }

    if(session->userauth_host_state == libssh2_NB_state_sent) {
        static const unsigned char reply_codes[3] =
            { SSH_MSG_USERAUTH_SUCCESS, SSH_MSG_USERAUTH_FAILURE, 0 };
        size_t data_len;
        rc = _libssh2_packet_requirev(session, reply_codes,
                                      &session->userauth_host_data,
                                      &data_len, 0, NULL, 0,
                                      &session->
                                      userauth_host_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                  "Would block");
        }

        session->userauth_host_state = libssh2_NB_state_idle;
        if(rc || data_len < 1) {
            return _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_UNVERIFIED,
                                  "Auth failed");
        }

        if(session->userauth_host_data[0] == SSH_MSG_USERAUTH_SUCCESS) {
            _libssh2_debug(session, LIBSSH2_TRACE_AUTH,
                           "Hostbased authentication successful");
            /* We are us and we've proved it. */
            LIBSSH2_FREE(session, session->userauth_host_data);
            session->userauth_host_data = NULL;
            session->state |= LIBSSH2_STATE_AUTHENTICATED;
            return 0;
        }
    }

    /* This public key is not allowed for this user on this server */
    LIBSSH2_FREE(session, session->userauth_host_data);
    session->userauth_host_data = NULL;
    return _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_UNVERIFIED,
                          "Invalid signature for supplied public key, or bad "
                          "username/public key combination");
}